

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ValuePlusArgsFunction::ValuePlusArgsFunction(ValuePlusArgsFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,ValuePlusArgs,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005a5c18;
  (this->super_SystemSubroutine).hasOutputArgs = true;
  return;
}

Assistant:

ValuePlusArgsFunction() :
        SystemSubroutine(KnownSystemName::ValuePlusArgs, SubroutineKind::Function) {
        hasOutputArgs = true;
    }